

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::syntax_tests::iu_GTestSyntaxTest_x_iutest_x_ExceptionValueEQ_Test::
~iu_GTestSyntaxTest_x_iutest_x_ExceptionValueEQ_Test
          (iu_GTestSyntaxTest_x_iutest_x_ExceptionValueEQ_Test *this)

{
  iu_GTestSyntaxTest_x_iutest_x_ExceptionValueEQ_Test *this_local;
  
  ~iu_GTestSyntaxTest_x_iutest_x_ExceptionValueEQ_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(GTestSyntaxTest, ExceptionValueEQ)
{
    if( int x = 1 )
        ASSERT_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        EXPECT_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        INFORM_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        ASSUME_THROW_VALUE_EQ(throw 1, int, x) << x;
}